

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O0

void __thiscall xLearn::OndiskReader::SetShuffle(OndiskReader *this,bool shuffle)

{
  ostream *poVar1;
  undefined1 in_SIL;
  string *in_RDI;
  LogSeverity unaff_retaddr;
  allocator *this_00;
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [24];
  string *in_stack_ffffffffffffffe8;
  Logger local_10;
  undefined3 in_stack_fffffffffffffff4;
  uint line;
  string *file;
  
  line = CONCAT13(in_SIL,in_stack_fffffffffffffff4) & 0x1ffffff;
  if ((char)(line >> 0x18) == '\x01') {
    file = in_RDI;
    Logger::Logger(&local_10,ERR);
    this_00 = &local_31;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_30,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/reader/reader.h"
               ,this_00);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"SetShuffle",&local_69);
    poVar1 = Logger::Start(unaff_retaddr,file,line,in_stack_ffffffffffffffe8);
    std::operator<<(poVar1,"Cannot set shuffle for OndiskReader.");
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
    Logger::~Logger((Logger *)this_00);
  }
  in_RDI[0x99] = (string)0x0;
  return;
}

Assistant:

void inline SetShuffle(bool shuffle) {
    if (shuffle == true) {
      LOG(ERR) << "Cannot set shuffle for OndiskReader.";
    }
    this->shuffle_ = false;
  }